

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseline.cc
# Opt level: O2

void predict_or_learn<true>(baseline *data,single_learner *base,example *ec)

{
  float fVar1;
  example *peVar2;
  vw *pvVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  
  if (data->check_enabled == true) {
    bVar4 = BASELINE::baseline_enabled(ec);
    if (!bVar4) {
      LEARNER::learner<char,_example>::learn(base,ec,0);
      return;
    }
  }
  if (data->global_only == true) {
    if (data->global_initialized == false) {
      init_global(data);
      data->global_initialized = true;
    }
    VW::copy_example_metadata(false,data->ec,ec);
    LEARNER::learner<char,_example>::predict(base,data->ec,0);
    (ec->l).simple.initial = (data->ec->pred).scalar;
  }
  LEARNER::learner<char,_example>::predict(base,ec,0);
  fVar1 = (ec->pred).scalar;
  peVar2 = data->ec;
  (peVar2->l).simple.initial = (ec->l).simple.initial;
  (peVar2->l).multi = (ec->l).multi;
  if (data->global_only == false) {
    VW::copy_example_metadata(false,data->ec,ec);
    VW::move_feature_namespace(data->ec,ec,0x80);
  }
  if (data->lr_scaling == true) {
    fVar6 = data->lr_multiplier;
    pvVar3 = data->all;
    if ((fVar6 == 0.0) && (!NAN(fVar6))) {
      fVar5 = ABS(pvVar3->sd->min_label);
      fVar6 = ABS(pvVar3->sd->max_label);
      if (fVar6 <= fVar5) {
        fVar6 = fVar5;
      }
      if (fVar6 <= 0.0001) {
        fVar6 = 0.0001;
      }
      if (1000.0 < fVar6) {
        fVar6 = 1000.0;
      }
    }
    pvVar3->eta = pvVar3->eta * fVar6;
    LEARNER::learner<char,_example>::learn(base,data->ec,0);
    data->all->eta = data->all->eta / fVar6;
  }
  else {
    LEARNER::learner<char,_example>::learn(base,data->ec,0);
  }
  (ec->l).simple.initial = (data->ec->pred).scalar;
  LEARNER::learner<char,_example>::learn(base,ec,0);
  if (data->global_only == false) {
    VW::move_feature_namespace(ec,data->ec,0x80);
  }
  (ec->pred).scalar = fVar1;
  return;
}

Assistant:

void predict_or_learn(baseline& data, single_learner& base, example& ec)
{
  // no baseline if check_enabled is true and example contains flag
  if (data.check_enabled && !BASELINE::baseline_enabled(&ec))
  {
    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);
    return;
  }

  // always do a full prediction, for safety in accurate predictive validation
  if (data.global_only)
  {
    if (!data.global_initialized)
    {
      init_global(data);
      data.global_initialized = true;
    }
    VW::copy_example_metadata(/*audit=*/false, data.ec, &ec);
    base.predict(*data.ec);
    ec.l.simple.initial = data.ec->pred.scalar;
    base.predict(ec);
  }
  else
    base.predict(ec);

  if (is_learn)
  {
    const float pred = ec.pred.scalar;  // save 'safe' prediction

    // now learn
    data.ec->l.simple = ec.l.simple;
    if (!data.global_only)
    {
      // move label & constant features data over to baseline example
      VW::copy_example_metadata(/*audit=*/false, data.ec, &ec);
      VW::move_feature_namespace(data.ec, &ec, constant_namespace);
    }

    // regress baseline on label
    if (data.lr_scaling)
    {
      float multiplier = data.lr_multiplier;
      if (multiplier == 0)
      {
        multiplier = max<float>(0.0001f, max<float>(abs(data.all->sd->min_label), abs(data.all->sd->max_label)));
        if (multiplier > max_multiplier)
          multiplier = max_multiplier;
      }
      data.all->eta *= multiplier;
      base.learn(*data.ec);
      data.all->eta /= multiplier;
    }
    else
      base.learn(*data.ec);

    // regress residual
    ec.l.simple.initial = data.ec->pred.scalar;
    base.learn(ec);

    if (!data.global_only)
    {
      // move feature data back to the original example
      VW::move_feature_namespace(&ec, data.ec, constant_namespace);
    }

    // return the safe prediction
    ec.pred.scalar = pred;
  }
}